

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-default-aes-impl.c
# Opt level: O2

uint32_t ndn_lite_default_aes_parse_unpadding_size(uint8_t *plaintext_value,uint32_t plaintext_size)

{
  uint8_t uVar1;
  long lVar2;
  uint uVar3;
  uint8_t *puVar4;
  bool bVar5;
  uint8_t uVar6;
  bool bVar7;
  
  puVar4 = plaintext_value + ((ulong)plaintext_size - 1);
  uVar1 = *puVar4;
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 0x10) {
      return plaintext_size;
    }
    if (uVar1 == "\x01\x02\x03\x04\x05\x06\a\b\t\n\v\f\r\x0e\x0f\x10"[lVar2]) break;
    lVar2 = lVar2 + 1;
    puVar4 = puVar4 + -1;
  }
  bVar5 = true;
  uVar6 = uVar1;
  while (bVar7 = uVar6 != '\0', uVar6 = uVar6 + 0xff, bVar7) {
    bVar5 = (bool)(bVar5 & *puVar4 == uVar1);
  }
  uVar3 = 0;
  if (bVar5) {
    uVar3 = ~(uint)lVar2;
  }
  return plaintext_size + uVar3;
}

Assistant:

uint32_t
ndn_lite_default_aes_parse_unpadding_size(uint8_t* plaintext_value, uint32_t plaintext_size)
{
  for (uint8_t i = 0; i < TC_AES_BLOCK_SIZE; i++)
    if (*(plaintext_value + plaintext_size - 1) == byte[i]) {
      bool satisfy = true;
      for (uint8_t j = 0; j < byte[i]; j++) {
        if (*(plaintext_value + plaintext_size - 1 - i) != byte[i]) {
          satisfy = false;
        }
      }
      if (satisfy) {
        return plaintext_size - i - 1;
      }
      else {
        return plaintext_size;
      }
    }
  return plaintext_size;
}